

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

void __thiscall gjkepa2_impl::GJK::getsupport(GJK *this,btVector3 *d,sSV *sv)

{
  undefined8 *in_RDX;
  btVector3 *in_RSI;
  btVector3 bVar1;
  btScalar *in_stack_ffffffffffffffa8;
  
  btVector3::length((btVector3 *)0x1e805c);
  bVar1 = operator/(in_RSI,in_stack_ffffffffffffffa8);
  *in_RDX = bVar1.m_floats._0_8_;
  in_RDX[1] = bVar1.m_floats._8_8_;
  bVar1 = MinkowskiDiff::Support(bVar1.m_floats._8_8_,bVar1.m_floats._0_8_);
  in_RDX[2] = bVar1.m_floats._0_8_;
  in_RDX[3] = bVar1.m_floats._8_8_;
  return;
}

Assistant:

void				getsupport(const btVector3& d,sSV& sv) const
			{
				sv.d	=	d/d.length();
				sv.w	=	m_shape.Support(sv.d);
			}